

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O3

void __thiscall Log::Add(Log *this,string *message)

{
  pointer pcVar1;
  undefined8 *puVar2;
  _func_void_string *p_Var3;
  string sVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined8 in_stack_ffffffffffffff78;
  undefined1 *puVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_ffffffffffffff88;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  pcVar1 = (this->_logText)._M_dataplus._M_p;
  puVar7 = &stack0xffffffffffffff90;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xffffffffffffff80,pcVar1,pcVar1 + (this->_logText)._M_string_length);
  std::__cxx11::string::append((char *)&stack0xffffffffffffff80);
  puVar5 = (undefined8 *)
           std::__cxx11::string::_M_append
                     (&stack0xffffffffffffff80,(ulong)(message->_M_dataplus)._M_p);
  puVar2 = (undefined8 *)*puVar5;
  puVar6 = puVar5 + 2;
  if (puVar2 == puVar6) {
    local_50 = *puVar6;
    uStack_48 = puVar5[3];
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
  }
  else {
    local_50 = puVar5[2];
    *puVar5 = puVar6;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    if (puVar2 != &local_50) {
      operator_delete(puVar2);
    }
  }
  if (puVar7 != &stack0xffffffffffffff90) {
    operator_delete(puVar7);
  }
  p_Var3 = this->_printFunction;
  if (p_Var3 != (_func_void_string *)0x0) {
    pcVar1 = (message->_M_dataplus)._M_p;
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_40,pcVar1,pcVar1 + message->_M_string_length);
    sVar4._M_string_length = (size_type)puVar7;
    sVar4._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff78;
    sVar4.field_2 = in_stack_ffffffffffffff88;
    (*p_Var3)(sVar4);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0]);
    }
  }
  return;
}

Assistant:

void Log::Add(string message) {
  _logText + "\n" + message;
  if (_printFunction != nullptr) {
    _printFunction(message);
  }
}